

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Bac_NtkTransformToPtrInputs(Bac_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  char *Entry;
  Vec_Ptr_t *vSigs;
  int iTerm;
  int i;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_NtkPiNum(p);
  p_00 = Vec_PtrAllocExact(iVar1);
  for (vSigs._4_4_ = 0; iVar1 = Bac_NtkPiNum(p), vSigs._4_4_ < iVar1; vSigs._4_4_ = vSigs._4_4_ + 1)
  {
    iVar1 = Bac_NtkPi(p,vSigs._4_4_);
    Entry = Bac_ObjNameStr(p,iVar1);
    Vec_PtrPush(p_00,Entry);
  }
  iVar1 = Ptr_CheckArray(p_00);
  if (iVar1 == 0) {
    __assert_fail("Ptr_CheckArray(vSigs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x1b4,"Vec_Ptr_t *Bac_NtkTransformToPtrInputs(Bac_Ntk_t *)");
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrInputs( Bac_Ntk_t * p )
{
    int i, iTerm;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iTerm, i )
        Vec_PtrPush( vSigs, Bac_ObjNameStr(p, iTerm) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}